

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

OPJ_BOOL opj_dwt_encode_procedure
                   (opj_thread_pool_t *tp,opj_tcd_tilecomp_t *tilec,
                   opj_encode_and_deinterleave_v_fnptr_type p_encode_and_deinterleave_v,
                   opj_encode_and_deinterleave_h_one_row_fnptr_type
                   p_encode_and_deinterleave_h_one_row)

{
  OPJ_UINT32 i;
  uint uVar1;
  OPJ_INT32 *pOVar2;
  uint uVar3;
  uint uVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 OVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  void *ptr;
  undefined8 *user_data;
  void *pvVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  size_t size;
  uint uVar18;
  opj_tcd_resolution_t *poVar19;
  OPJ_BOOL OVar20;
  bool bVar21;
  
  uVar4 = opj_thread_pool_get_thread_count(tp);
  pOVar2 = tilec->data;
  i = tilec->numresolutions;
  OVar5 = tilec->x1 - tilec->x0;
  poVar19 = tilec->resolutions;
  OVar6 = opj_dwt_max_resolution(poVar19,i);
  size = (ulong)OVar6 << 5;
  ptr = opj_aligned_32_malloc(size);
  if (ptr == (void *)0x0 && OVar6 != 0) {
    return 0;
  }
  uVar12 = (long)(int)i - 1;
  poVar19 = poVar19 + uVar12;
  while( true ) {
    OVar20 = 1;
    iVar11 = (int)uVar12;
    uVar12 = (ulong)(iVar11 - 1);
    if (iVar11 == 0) break;
    uVar1 = poVar19->x0;
    uVar13 = poVar19->x1 - uVar1;
    uVar7 = poVar19->y1 - poVar19->y0;
    iVar11 = poVar19[-1].x1 - poVar19[-1].x0;
    uVar18 = poVar19->y0 & 1;
    if (((int)uVar4 < 2) || (uVar13 < 0x10)) {
      uVar18 = uVar18 ^ 1;
      uVar14 = 0;
      while (uVar3 = (uint)uVar14, uVar3 + 7 < uVar13) {
        (*p_encode_and_deinterleave_v)(pOVar2 + uVar14,ptr,uVar7,uVar18,OVar5,8);
        uVar14 = (ulong)(uVar3 + 8);
      }
      if (uVar3 <= uVar13 && uVar13 - uVar3 != 0) {
        (*p_encode_and_deinterleave_v)(pOVar2 + uVar14,ptr,uVar7,uVar18,OVar5,uVar13 - uVar3);
      }
    }
    else {
      iVar17 = poVar19[-1].y1 - poVar19[-1].y0;
      uVar3 = uVar4;
      if (uVar13 < uVar4) {
        uVar3 = uVar13;
      }
      iVar15 = 0;
      uVar8 = uVar13 / uVar3 & 0xfffffff8;
      while (uVar3 != 0) {
        user_data = (undefined8 *)opj_malloc(0x38);
        if (user_data == (undefined8 *)0x0) goto LAB_0010a4db;
        pvVar10 = opj_aligned_32_malloc(size);
        *user_data = pvVar10;
        if (pvVar10 == (void *)0x0) goto LAB_0010a4ec;
        *(uint *)(user_data + 1) = uVar7 - iVar17;
        *(int *)((long)user_data + 0xc) = iVar17;
        *(uint *)(user_data + 2) = uVar18;
        *(uint *)(user_data + 3) = uVar7;
        *(OPJ_UINT32 *)((long)user_data + 0x1c) = OVar5;
        user_data[4] = pOVar2;
        *(uint *)(user_data + 5) = iVar15 * uVar8;
        iVar15 = iVar15 + 1;
        uVar9 = iVar15 * uVar8;
        if (uVar3 == 1) {
          uVar9 = uVar13;
        }
        *(uint *)((long)user_data + 0x2c) = uVar9;
        user_data[6] = p_encode_and_deinterleave_v;
        opj_thread_pool_submit_job(tp,opj_dwt_encode_v_func,user_data);
        uVar3 = uVar3 - 1;
      }
      opj_thread_pool_wait_completion(tp,0);
    }
    poVar19 = poVar19 + -1;
    uVar1 = uVar1 & 1;
    if (((int)uVar4 < 2) || (uVar7 < 2)) {
      uVar14 = (ulong)uVar7;
      uVar16 = 0;
      while (bVar21 = uVar14 != 0, uVar14 = uVar14 - 1, bVar21) {
        (*p_encode_and_deinterleave_h_one_row)(pOVar2 + uVar16,ptr,uVar13,uVar1 ^ 1);
        uVar16 = (ulong)((int)uVar16 + OVar5);
      }
    }
    else {
      uVar18 = uVar4;
      if (uVar7 < uVar4) {
        uVar18 = uVar7;
      }
      iVar17 = 0;
      uVar3 = uVar18;
      while (uVar3 != 0) {
        user_data = (undefined8 *)opj_malloc(0x38);
        if (user_data == (undefined8 *)0x0) goto LAB_0010a4db;
        pvVar10 = opj_aligned_32_malloc(size);
        *user_data = pvVar10;
        if (pvVar10 == (void *)0x0) goto LAB_0010a4ec;
        *(uint *)(user_data + 1) = uVar13 - iVar11;
        *(int *)((long)user_data + 0xc) = iVar11;
        *(uint *)(user_data + 2) = uVar1;
        *(uint *)(user_data + 3) = uVar13;
        *(OPJ_UINT32 *)((long)user_data + 0x1c) = OVar5;
        user_data[4] = pOVar2;
        *(uint *)(user_data + 5) = iVar17 * (uVar7 / uVar18);
        iVar17 = iVar17 + 1;
        uVar8 = iVar17 * (uVar7 / uVar18);
        if (uVar3 == 1) {
          uVar8 = uVar7;
        }
        *(uint *)((long)user_data + 0x2c) = uVar8;
        user_data[6] = p_encode_and_deinterleave_h_one_row;
        opj_thread_pool_submit_job(tp,opj_dwt_encode_h_func,user_data);
        uVar3 = uVar3 - 1;
      }
      opj_thread_pool_wait_completion(tp,0);
    }
  }
  goto LAB_0010a508;
LAB_0010a4db:
  opj_thread_pool_wait_completion(tp,0);
  goto LAB_0010a503;
LAB_0010a4ec:
  opj_thread_pool_wait_completion(tp,0);
  opj_free(user_data);
LAB_0010a503:
  OVar20 = 0;
LAB_0010a508:
  opj_aligned_free(ptr);
  return OVar20;
}

Assistant:

static INLINE OPJ_BOOL opj_dwt_encode_procedure(opj_thread_pool_t* tp,
        opj_tcd_tilecomp_t * tilec,
        opj_encode_and_deinterleave_v_fnptr_type p_encode_and_deinterleave_v,
        opj_encode_and_deinterleave_h_one_row_fnptr_type
        p_encode_and_deinterleave_h_one_row)
{
    OPJ_INT32 i;
    OPJ_INT32 *bj = 00;
    OPJ_UINT32 w;
    OPJ_INT32 l;

    OPJ_SIZE_T l_data_size;

    opj_tcd_resolution_t * l_cur_res = 0;
    opj_tcd_resolution_t * l_last_res = 0;
    const int num_threads = opj_thread_pool_get_thread_count(tp);
    OPJ_INT32 * OPJ_RESTRICT tiledp = tilec->data;

    w = (OPJ_UINT32)(tilec->x1 - tilec->x0);
    l = (OPJ_INT32)tilec->numresolutions - 1;

    l_cur_res = tilec->resolutions + l;
    l_last_res = l_cur_res - 1;

    l_data_size = opj_dwt_max_resolution(tilec->resolutions, tilec->numresolutions);
    /* overflow check */
    if (l_data_size > (SIZE_MAX / (NB_ELTS_V8 * sizeof(OPJ_INT32)))) {
        /* FIXME event manager error callback */
        return OPJ_FALSE;
    }
    l_data_size *= NB_ELTS_V8 * sizeof(OPJ_INT32);
    bj = (OPJ_INT32*)opj_aligned_32_malloc(l_data_size);
    /* l_data_size is equal to 0 when numresolutions == 1 but bj is not used */
    /* in that case, so do not error out */
    if (l_data_size != 0 && ! bj) {
        return OPJ_FALSE;
    }
    i = l;

    while (i--) {
        OPJ_UINT32 j;
        OPJ_UINT32 rw;           /* width of the resolution level computed   */
        OPJ_UINT32 rh;           /* height of the resolution level computed  */
        OPJ_UINT32
        rw1;      /* width of the resolution level once lower than computed one                                       */
        OPJ_UINT32
        rh1;      /* height of the resolution level once lower than computed one                                      */
        OPJ_INT32 cas_col;  /* 0 = non inversion on horizontal filtering 1 = inversion between low-pass and high-pass filtering */
        OPJ_INT32 cas_row;  /* 0 = non inversion on vertical filtering 1 = inversion between low-pass and high-pass filtering   */
        OPJ_INT32 dn, sn;

        rw  = (OPJ_UINT32)(l_cur_res->x1 - l_cur_res->x0);
        rh  = (OPJ_UINT32)(l_cur_res->y1 - l_cur_res->y0);
        rw1 = (OPJ_UINT32)(l_last_res->x1 - l_last_res->x0);
        rh1 = (OPJ_UINT32)(l_last_res->y1 - l_last_res->y0);

        cas_row = l_cur_res->x0 & 1;
        cas_col = l_cur_res->y0 & 1;

        sn = (OPJ_INT32)rh1;
        dn = (OPJ_INT32)(rh - rh1);

        /* Perform vertical pass */
        if (num_threads <= 1 || rw < 2 * NB_ELTS_V8) {
            for (j = 0; j + NB_ELTS_V8 - 1 < rw; j += NB_ELTS_V8) {
                p_encode_and_deinterleave_v(tiledp + j,
                                            bj,
                                            rh,
                                            cas_col == 0,
                                            w,
                                            NB_ELTS_V8);
            }
            if (j < rw) {
                p_encode_and_deinterleave_v(tiledp + j,
                                            bj,
                                            rh,
                                            cas_col == 0,
                                            w,
                                            rw - j);
            }
        }  else {
            OPJ_UINT32 num_jobs = (OPJ_UINT32)num_threads;
            OPJ_UINT32 step_j;

            if (rw < num_jobs) {
                num_jobs = rw;
            }
            step_j = ((rw / num_jobs) / NB_ELTS_V8) * NB_ELTS_V8;

            for (j = 0; j < num_jobs; j++) {
                opj_dwt_encode_v_job_t* job;

                job = (opj_dwt_encode_v_job_t*) opj_malloc(sizeof(opj_dwt_encode_v_job_t));
                if (!job) {
                    opj_thread_pool_wait_completion(tp, 0);
                    opj_aligned_free(bj);
                    return OPJ_FALSE;
                }
                job->v.mem = (OPJ_INT32*)opj_aligned_32_malloc(l_data_size);
                if (!job->v.mem) {
                    opj_thread_pool_wait_completion(tp, 0);
                    opj_free(job);
                    opj_aligned_free(bj);
                    return OPJ_FALSE;
                }
                job->v.dn = dn;
                job->v.sn = sn;
                job->v.cas = cas_col;
                job->rh = rh;
                job->w = w;
                job->tiledp = tiledp;
                job->min_j = j * step_j;
                job->max_j = (j + 1 == num_jobs) ? rw : (j + 1) * step_j;
                job->p_encode_and_deinterleave_v = p_encode_and_deinterleave_v;
                opj_thread_pool_submit_job(tp, opj_dwt_encode_v_func, job);
            }
            opj_thread_pool_wait_completion(tp, 0);
        }

        sn = (OPJ_INT32)rw1;
        dn = (OPJ_INT32)(rw - rw1);

        /* Perform horizontal pass */
        if (num_threads <= 1 || rh <= 1) {
            for (j = 0; j < rh; j++) {
                OPJ_INT32* OPJ_RESTRICT aj = tiledp + j * w;
                (*p_encode_and_deinterleave_h_one_row)(aj, bj, rw,
                                                       cas_row == 0 ? OPJ_TRUE : OPJ_FALSE);
            }
        }  else {
            OPJ_UINT32 num_jobs = (OPJ_UINT32)num_threads;
            OPJ_UINT32 step_j;

            if (rh < num_jobs) {
                num_jobs = rh;
            }
            step_j = (rh / num_jobs);

            for (j = 0; j < num_jobs; j++) {
                opj_dwt_encode_h_job_t* job;

                job = (opj_dwt_encode_h_job_t*) opj_malloc(sizeof(opj_dwt_encode_h_job_t));
                if (!job) {
                    opj_thread_pool_wait_completion(tp, 0);
                    opj_aligned_free(bj);
                    return OPJ_FALSE;
                }
                job->h.mem = (OPJ_INT32*)opj_aligned_32_malloc(l_data_size);
                if (!job->h.mem) {
                    opj_thread_pool_wait_completion(tp, 0);
                    opj_free(job);
                    opj_aligned_free(bj);
                    return OPJ_FALSE;
                }
                job->h.dn = dn;
                job->h.sn = sn;
                job->h.cas = cas_row;
                job->rw = rw;
                job->w = w;
                job->tiledp = tiledp;
                job->min_j = j * step_j;
                job->max_j = (j + 1U) * step_j; /* this can overflow */
                if (j == (num_jobs - 1U)) {  /* this will take care of the overflow */
                    job->max_j = rh;
                }
                job->p_function = p_encode_and_deinterleave_h_one_row;
                opj_thread_pool_submit_job(tp, opj_dwt_encode_h_func, job);
            }
            opj_thread_pool_wait_completion(tp, 0);
        }

        l_cur_res = l_last_res;

        --l_last_res;
    }

    opj_aligned_free(bj);
    return OPJ_TRUE;
}